

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall StringInstance::value_abi_cxx11_(StringInstance *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x58));
  return in_RDI;
}

Assistant:

std::string StringInstance::value() const {
    return _value;
}